

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2mps.cpp
# Opt level: O0

ssize_t __thiscall MPS::write(MPS *this,int __fd,void *__buf,size_t __n)

{
  runtime_error *this_00;
  ssize_t extraout_RAX;
  undefined8 *local_228;
  void *local_208 [3];
  size_t local_1f0;
  char local_148 [8];
  char _error_msg_ [256];
  int local_3c;
  uint local_38;
  int i;
  va_list v;
  int count_local;
  MPS *this_local;
  
  local_208[2] = __buf;
  local_1f0 = __n;
  clear(this);
  v[0]._0_8_ = &stack0x00000008;
  local_38 = 0x10;
  for (local_3c = 0; local_3c < __fd; local_3c = local_3c + 1) {
    if (local_38 < 0x29) {
      local_228 = (undefined8 *)((long)local_208 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_228 = (undefined8 *)v[0]._0_8_;
      v[0]._0_8_ = v[0]._0_8_ + 8;
    }
    add_field(this,(char *)*local_228);
  }
  if (0x4f < this->p) {
    snprintf(local_148,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","p < BUF_LEN"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2mps.cpp"
             ,0x3b);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_148);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->buf[this->p] = '\0';
  fprintf((FILE *)this->fout,"%s\n",this->buf);
  clear(this);
  return extraout_RAX;
}

Assistant:

void write(int count, ...) {
		clear();

		va_list v;
		va_start(v, count);
		for (int i = 0; i < count; i++) {
			add_field(va_arg(v, const char *));
		}
		va_end(v);

		throw_assert(p < BUF_LEN);
		buf[p] = 0;
		fprintf(fout, "%s\n", buf);
		clear();
	}